

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::unit,units::unit>(double val,unit *start,unit *result,double baseValue)

{
  unit *puVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  bool local_81;
  bool local_75;
  unit local_5c;
  unit local_54;
  unit_data local_4c;
  double local_48;
  double converted_val;
  unit_data local_38;
  unit_data local_34;
  double local_30;
  double baseValue_local;
  unit *result_local;
  unit *start_local;
  double val_local;
  
  local_30 = baseValue;
  baseValue_local = (double)result;
  result_local = start;
  start_local = (unit *)val;
  bVar2 = unit::operator==(start,result);
  if (((bVar2) || (bVar2 = is_default(result_local), bVar2)) ||
     (bVar2 = is_default((unit *)baseValue_local), bVar2)) {
    return (double)start_local;
  }
  local_34 = unit::base_units(result_local);
  local_38 = unit::base_units((unit *)baseValue_local);
  bVar2 = detail::unit_data::operator==(&local_34,&local_38);
  puVar1 = start_local;
  if (bVar2) {
    dVar5 = unit::multiplier(result_local);
    dVar6 = unit::multiplier((unit *)baseValue_local);
    return ((double)puVar1 * dVar5) / dVar6;
  }
  bVar2 = unit::is_per_unit(result_local);
  bVar3 = unit::is_per_unit((unit *)baseValue_local);
  puVar1 = result_local;
  if (bVar2 != bVar3) {
    local_4c = unit::base_units((unit *)baseValue_local);
    bVar2 = unit::has_same_base(puVar1,&local_4c);
    local_81 = true;
    if (!bVar2) {
      local_54 = unit_cast(result_local);
      bVar2 = unit::operator==((unit *)&pu,&local_54);
      local_81 = true;
      if (!bVar2) {
        local_5c = unit_cast((unit *)baseValue_local);
        local_81 = unit::operator==((unit *)&pu,&local_5c);
      }
    }
    if (local_81 == false) {
      return NAN;
    }
    bVar2 = unit::is_per_unit(result_local);
    if (bVar2) {
      start_local = (unit *)((double)start_local * local_30);
    }
    puVar1 = start_local;
    dVar5 = unit::multiplier(result_local);
    dVar6 = unit::multiplier((unit *)baseValue_local);
    start_local = (unit *)(((double)puVar1 * dVar5) / dVar6);
    bVar2 = unit::is_per_unit((unit *)baseValue_local);
    if (bVar2) {
      start_local = (unit *)((double)start_local / local_30);
    }
    return (double)start_local;
  }
  bVar2 = unit::has_e_flag(result_local);
  if (!bVar2) {
    bVar2 = unit::has_e_flag((unit *)baseValue_local);
    local_75 = false;
    if (!bVar2) goto LAB_001623cc;
  }
  puVar1 = result_local;
  converted_val._4_4_ = unit::base_units((unit *)baseValue_local);
  local_75 = unit::has_same_base(puVar1,(unit_data *)((long)&converted_val + 4));
LAB_001623cc:
  if (local_75 != false) {
    local_48 = detail::convertFlaggedUnits<units::unit,units::unit>
                         ((double)start_local,result_local,(unit *)baseValue_local,local_30);
    uVar4 = std::isnan(local_48);
    if ((uVar4 & 1) == 0) {
      return local_48;
    }
  }
  dVar5 = convert<units::unit,units::unit>((double)start_local,result_local,(unit *)baseValue_local)
  ;
  return dVar5;
}

Assistant:

double convert(double val, const UX& start, const UX2& result, double baseValue)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }

    // if the per unit is equivalent, no baseValue is needed so give to first
    // function
    if (start.is_per_unit() == result.is_per_unit()) {
        if ((start.has_e_flag() || result.has_e_flag()) &&
            start.has_same_base(result.base_units())) {
            double converted_val =
                detail::convertFlaggedUnits(val, start, result, baseValue);
            if (!std::isnan(converted_val)) {
                return converted_val;
            }
        }
        return convert(val, start, result);
    }

    if (start.has_same_base(result.base_units()) || pu == unit_cast(start) ||
        pu == unit_cast(result)) {
        if (start.is_per_unit()) {
            val = val * baseValue;
        }
        val = val * start.multiplier() / result.multiplier();
        if (result.is_per_unit()) {
            val /= baseValue;
        }
        return val;
    }
    // this would require two base values which power might be assumed but
    // assuming a base voltage is dangerous
    return constants::invalid_conversion;
}